

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O1

Gia_Man_t *
Dar_NewChoiceSynthesis
          (Aig_Man_t *pAig,int fBalance,int fUpdateLevel,int fPower,int fLightSynth,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  Vec_Ptr_t *vGias;
  void **ppvVar6;
  Gia_Man_t *pGVar7;
  Aig_Man_t *pAVar8;
  long lVar9;
  
  if (fUpdateLevel == 0) {
LAB_004adb5e:
    fUpdateLevel = 0;
  }
  else {
    iVar5 = Dar_NewChoiceSynthesisGuard(pAig);
    if (iVar5 != 0) {
      if (fVerbose != 0) {
        puts("Warning: Due to high fanout count of some nodes, level updating is disabled.");
      }
      goto LAB_004adb5e;
    }
  }
  vGias = (Vec_Ptr_t *)malloc(0x10);
  vGias->nCap = 8;
  vGias->nSize = 0;
  ppvVar6 = (void **)malloc(0x40);
  vGias->pArray = ppvVar6;
  pGVar7 = Gia_ManFromAig(pAig);
  uVar1 = vGias->nCap;
  if (vGias->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vGias->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vGias->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_004adbef;
      if (vGias->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vGias->pArray,(ulong)uVar1 << 4);
      }
    }
    vGias->pArray = ppvVar6;
    vGias->nCap = iVar5;
  }
LAB_004adbef:
  iVar5 = vGias->nSize;
  vGias->nSize = iVar5 + 1;
  vGias->pArray[iVar5] = pGVar7;
  pAVar8 = Dar_NewCompress(pAig,fBalance,fUpdateLevel,fPower,fVerbose);
  pGVar7 = Gia_ManFromAig(pAVar8);
  uVar1 = vGias->nCap;
  if (vGias->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vGias->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vGias->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_004adc86;
      if (vGias->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vGias->pArray,(ulong)uVar1 << 4);
      }
    }
    vGias->pArray = ppvVar6;
    vGias->nCap = iVar5;
  }
LAB_004adc86:
  iVar5 = vGias->nSize;
  vGias->nSize = iVar5 + 1;
  vGias->pArray[iVar5] = pGVar7;
  pAVar8 = Dar_NewCompress2(pAVar8,fBalance,fUpdateLevel,1,fPower,fLightSynth,fVerbose);
  pGVar7 = Gia_ManFromAig(pAVar8);
  uVar1 = vGias->nCap;
  if (vGias->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vGias->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vGias->pArray,0x80);
      }
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_004add29;
      if (vGias->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vGias->pArray,(ulong)uVar1 << 4);
      }
    }
    vGias->pArray = ppvVar6;
    vGias->nCap = iVar5;
  }
LAB_004add29:
  iVar5 = vGias->nSize;
  vGias->nSize = iVar5 + 1;
  vGias->pArray[iVar5] = pGVar7;
  Aig_ManStop(pAVar8);
  iVar5 = vGias->nSize;
  if (iVar5 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
  }
  ppvVar6 = vGias->pArray;
  uVar1 = iVar5 - 1;
  vGias->nSize = uVar1;
  if (iVar5 == 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = ppvVar6[uVar1];
  pvVar4 = *ppvVar6;
  uVar2 = vGias->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      ppvVar6 = (void **)realloc(ppvVar6,0x80);
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_004adda6;
      ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar2 << 4);
    }
    vGias->pArray = ppvVar6;
    vGias->nCap = iVar5;
  }
LAB_004adda6:
  iVar5 = vGias->nSize;
  vGias->nSize = iVar5 + 1;
  vGias->pArray[iVar5] = pvVar4;
  if (-1 < (long)iVar5) {
    *vGias->pArray = pvVar3;
    pGVar7 = Gia_ManChoiceMiter(vGias);
    if (0 < vGias->nSize) {
      lVar9 = 0;
      do {
        Gia_ManStop((Gia_Man_t *)vGias->pArray[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 < vGias->nSize);
    }
    if (vGias->pArray != (void **)0x0) {
      free(vGias->pArray);
      vGias->pArray = (void **)0x0;
    }
    free(vGias);
    return pGVar7;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

Gia_Man_t * Dar_NewChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fLightSynth, int fVerbose )
//alias resyn    "b; rw; rwz; b; rwz; b"
//alias resyn2   "b; rw; rf; b; rw; rwz; b; rfz; rwz; b"
{
    Vec_Ptr_t * vGias;
    Gia_Man_t * pGia, * pTemp;
    int i;

    if ( fUpdateLevel && Dar_NewChoiceSynthesisGuard(pAig) )
    {
        if ( fVerbose )
            printf( "Warning: Due to high fanout count of some nodes, level updating is disabled.\n" );
        fUpdateLevel = 0;
    }

    vGias = Vec_PtrAlloc( 3 );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );

    pAig = Dar_NewCompress( pAig, fBalance, fUpdateLevel, fPower, fVerbose );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );
//Aig_ManPrintStats( pAig );

    pAig = Dar_NewCompress2( pAig, fBalance, fUpdateLevel, 1, fPower, fLightSynth, fVerbose );
    pGia = Gia_ManFromAig(pAig);
    Vec_PtrPush( vGias, pGia );
//Aig_ManPrintStats( pAig );

    Aig_ManStop( pAig );

    // swap around the first and the last
    pTemp = (Gia_Man_t *)Vec_PtrPop( vGias );
    Vec_PtrPush( vGias, Vec_PtrEntry(vGias,0) );
    Vec_PtrWriteEntry( vGias, 0, pTemp );

//    Aig_Man_t * pAig;
//    int i;
//    printf( "Choicing will be performed with %d AIGs:\n", Vec_PtrSize(p->vAigs) );
//    Vec_PtrForEachEntry( Aig_Man_t *, p->vAigs, pAig, i )
//        Aig_ManPrintStats( pAig );

    // derive the miter
    pGia = Gia_ManChoiceMiter( vGias );

    // cleanup
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
        Gia_ManStop( pTemp );
    Vec_PtrFree( vGias );
    return pGia;
}